

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O3

bool xercesc_4_0::XMLString::isInList(XMLCh *toFind,XMLCh *enumList)

{
  short *psVar1;
  long lVar2;
  XMLCh XVar3;
  long lVar4;
  XMLCh *listPtr;
  
  lVar2 = 0;
  if (toFind != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)toFind + lVar2);
      lVar2 = lVar2 + 2;
    } while (*psVar1 != 0);
    lVar2 = (lVar2 >> 1) + -1;
  }
  do {
    XVar3 = *enumList;
    if (XVar3 == L'\0') {
      return false;
    }
    lVar4 = 0;
    if (lVar2 == 0) {
LAB_0025107f:
      if (lVar4 == lVar2) goto LAB_00251084;
    }
    else {
      do {
        if (enumList[lVar4] != toFind[lVar4]) goto LAB_0025107f;
        lVar4 = lVar4 + 1;
      } while (lVar2 != lVar4);
LAB_00251084:
      if ((enumList[lVar2] & 0xffdfU) == 0) {
        return true;
      }
    }
    while( true ) {
      enumList = enumList + 1;
      if (XVar3 == L'\0') {
        return false;
      }
      if (XVar3 == L' ') break;
      XVar3 = *enumList;
    }
  } while( true );
}

Assistant:

bool XMLString::isInList(const XMLCh* const toFind, const XMLCh* const enumList)
{
    //
    //  We loop through the values in the list via this outer loop. We end
    //  when we hit the end of the enum list or get a match.
    //
    const XMLCh* listPtr = enumList;
    const XMLSize_t findLen = XMLString::stringLen(toFind);
    while (*listPtr)
    {
        XMLSize_t testInd;
        for (testInd = 0; testInd < findLen; testInd++)
        {
            //
            //  If they don't match, then reset and try again. Note that
            //  hitting the end of the current item will cause a mismatch
            //  because there can be no spaces in the toFind string.
            //
            if (listPtr[testInd] != toFind[testInd])
                break;
        }

        //
        //  If we went the distance, see if we matched. If we did, the current
        //  list character has to be null or space.
        //
        if (testInd == findLen)
        {
            if ((listPtr[testInd] == chSpace) || !listPtr[testInd])
                return true;
        }

        // Run the list pointer up to the next substring
        while ((*listPtr != chSpace) && *listPtr)
            listPtr++;

        // If we hit the end, then we failed
        if (!*listPtr)
            return false;

        // Else move past the space and try again
        listPtr++;
    }

    // We never found it
    return false;
}